

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sampleInsert(Stat4Accum *p,Stat4Sample *pNew,int nEqZero)

{
  tRowcnt *ptVar1;
  tRowcnt *ptVar2;
  tRowcnt *ptVar3;
  int iVar4;
  Stat4Sample *pSVar5;
  int local_64;
  int iMin;
  tRowcnt *anDLt;
  tRowcnt *anLt;
  tRowcnt *anEq;
  Stat4Sample *pMin;
  Stat4Sample *pOld;
  Stat4Sample *pUpgrade;
  int i;
  Stat4Sample *pSample;
  int nEqZero_local;
  Stat4Sample *pNew_local;
  Stat4Accum *p_local;
  
  if (p->nMaxEqZero < nEqZero) {
    p->nMaxEqZero = nEqZero;
  }
  if (pNew->isPSample == '\0') {
    pOld = (Stat4Sample *)0x0;
    pUpgrade._4_4_ = p->nSample;
    while (pUpgrade._4_4_ = pUpgrade._4_4_ + -1, -1 < pUpgrade._4_4_) {
      pSVar5 = p->a + pUpgrade._4_4_;
      if (pSVar5->anEq[pNew->iCol] == 0) {
        if (pSVar5->isPSample != '\0') {
          return;
        }
        if ((pOld == (Stat4Sample *)0x0) || (iVar4 = sampleIsBetter(p,pSVar5,pOld), iVar4 != 0)) {
          pOld = pSVar5;
        }
      }
    }
    if (pOld != (Stat4Sample *)0x0) {
      pOld->iCol = pNew->iCol;
      pOld->anEq[pOld->iCol] = pNew->anEq[pOld->iCol];
      goto LAB_001e4b15;
    }
  }
  if (p->mxSample <= p->nSample) {
    pSVar5 = p->a + p->iMin;
    ptVar1 = pSVar5->anEq;
    ptVar2 = pSVar5->anLt;
    ptVar3 = pSVar5->anDLt;
    sampleClear(p->db,pSVar5);
    memmove(pSVar5,pSVar5 + 1,(long)((p->nSample - p->iMin) + -1) * 0x30);
    pSVar5 = p->a + (p->nSample + -1);
    pSVar5->nRowid = 0;
    pSVar5->anEq = ptVar1;
    pSVar5->anDLt = ptVar3;
    pSVar5->anLt = ptVar2;
    p->nSample = p->mxSample + -1;
  }
  pSVar5 = p->a;
  iVar4 = p->nSample;
  sampleCopy(p,pSVar5 + iVar4,pNew);
  p->nSample = p->nSample + 1;
  memset(pSVar5[iVar4].anEq,0,(long)nEqZero << 2);
LAB_001e4b15:
  if (p->mxSample <= p->nSample) {
    local_64 = -1;
    for (pUpgrade._4_4_ = 0; pUpgrade._4_4_ < p->mxSample; pUpgrade._4_4_ = pUpgrade._4_4_ + 1) {
      if ((p->a[pUpgrade._4_4_].isPSample == '\0') &&
         ((local_64 < 0 ||
          (iVar4 = sampleIsBetter(p,p->a + local_64,p->a + pUpgrade._4_4_), iVar4 != 0)))) {
        local_64 = pUpgrade._4_4_;
      }
    }
    p->iMin = local_64;
  }
  return;
}

Assistant:

static void sampleInsert(Stat4Accum *p, Stat4Sample *pNew, int nEqZero){
  Stat4Sample *pSample = 0;
  int i;

  assert( IsStat4 || nEqZero==0 );

#ifdef SQLITE_ENABLE_STAT4
  /* Stat4Accum.nMaxEqZero is set to the maximum number of leading 0
  ** values in the anEq[] array of any sample in Stat4Accum.a[]. In
  ** other words, if nMaxEqZero is n, then it is guaranteed that there
  ** are no samples with Stat4Sample.anEq[m]==0 for (m>=n). */
  if( nEqZero>p->nMaxEqZero ){
    p->nMaxEqZero = nEqZero;
  }
  if( pNew->isPSample==0 ){
    Stat4Sample *pUpgrade = 0;
    assert( pNew->anEq[pNew->iCol]>0 );

    /* This sample is being added because the prefix that ends in column 
    ** iCol occurs many times in the table. However, if we have already
    ** added a sample that shares this prefix, there is no need to add
    ** this one. Instead, upgrade the priority of the highest priority
    ** existing sample that shares this prefix.  */
    for(i=p->nSample-1; i>=0; i--){
      Stat4Sample *pOld = &p->a[i];
      if( pOld->anEq[pNew->iCol]==0 ){
        if( pOld->isPSample ) return;
        assert( pOld->iCol>pNew->iCol );
        assert( sampleIsBetter(p, pNew, pOld) );
        if( pUpgrade==0 || sampleIsBetter(p, pOld, pUpgrade) ){
          pUpgrade = pOld;
        }
      }
    }
    if( pUpgrade ){
      pUpgrade->iCol = pNew->iCol;
      pUpgrade->anEq[pUpgrade->iCol] = pNew->anEq[pUpgrade->iCol];
      goto find_new_min;
    }
  }
#endif

  /* If necessary, remove sample iMin to make room for the new sample. */
  if( p->nSample>=p->mxSample ){
    Stat4Sample *pMin = &p->a[p->iMin];
    tRowcnt *anEq = pMin->anEq;
    tRowcnt *anLt = pMin->anLt;
    tRowcnt *anDLt = pMin->anDLt;
    sampleClear(p->db, pMin);
    memmove(pMin, &pMin[1], sizeof(p->a[0])*(p->nSample-p->iMin-1));
    pSample = &p->a[p->nSample-1];
    pSample->nRowid = 0;
    pSample->anEq = anEq;
    pSample->anDLt = anDLt;
    pSample->anLt = anLt;
    p->nSample = p->mxSample-1;
  }

  /* The "rows less-than" for the rowid column must be greater than that
  ** for the last sample in the p->a[] array. Otherwise, the samples would
  ** be out of order. */
#ifdef SQLITE_ENABLE_STAT4
  assert( p->nSample==0 
       || pNew->anLt[p->nCol-1] > p->a[p->nSample-1].anLt[p->nCol-1] );
#endif

  /* Insert the new sample */
  pSample = &p->a[p->nSample];
  sampleCopy(p, pSample, pNew);
  p->nSample++;

  /* Zero the first nEqZero entries in the anEq[] array. */
  memset(pSample->anEq, 0, sizeof(tRowcnt)*nEqZero);

#ifdef SQLITE_ENABLE_STAT4
 find_new_min:
#endif
  if( p->nSample>=p->mxSample ){
    int iMin = -1;
    for(i=0; i<p->mxSample; i++){
      if( p->a[i].isPSample ) continue;
      if( iMin<0 || sampleIsBetter(p, &p->a[iMin], &p->a[i]) ){
        iMin = i;
      }
    }
    assert( iMin>=0 );
    p->iMin = iMin;
  }
}